

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON_Material::MaterialChannelIndexFromId(ON_Material *this,ON_UUID material_channel_id)

{
  bool bVar1;
  ulong uVar2;
  ON_UuidIndex *pOVar3;
  ON_UuidIndex *b;
  ON_UUID_struct local_30;
  
  local_30.Data4 = material_channel_id.Data4;
  local_30._0_8_ = material_channel_id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,&local_30);
  if ((!bVar1) && (uVar2 = (ulong)(uint)(this->m_material_channel).m_count, uVar2 != 0)) {
    b = (this->m_material_channel).m_a;
    pOVar3 = b + uVar2;
    for (; b < pOVar3; b = b + 1) {
      bVar1 = ::operator==(&local_30,&b->m_id);
      if (bVar1) {
        return b->m_i;
      }
    }
  }
  return 0;
}

Assistant:

int ON_Material::MaterialChannelIndexFromId(
  ON_UUID material_channel_id
) const
{
  for (;;)
  {
    if (ON_nil_uuid == material_channel_id)
      break;
    const unsigned count = m_material_channel.UnsignedCount();
    if (0 == count)
      break;
    const ON_UuidIndex* a = m_material_channel.Array();
    for ( const ON_UuidIndex* a1 = a + count; a < a1; ++a)
    {
      if (material_channel_id == a->m_id)
        return a->m_i;
    }
    break;
  }

  return 0;
}